

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt * __thiscall slang::SVInt::operator|=(SVInt *this,SVInt *rhs)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  bool bVar3;
  SVInt *pSVar4;
  byte bVar5;
  SVInt *in_RSI;
  SVInt *in_RDI;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t words;
  bool bothSigned;
  SVInt *in_stack_ffffffffffffff80;
  SVInt *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint3 in_stack_ffffffffffffff94;
  bitwidth_t bits;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint local_58;
  uint local_54;
  uint32_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffe0;
  
  if ((in_RDI->super_SVIntStorage).bitWidth != (in_RSI->super_SVIntStorage).bitWidth) {
    bits = (bitwidth_t)in_stack_ffffffffffffff94;
    if (((in_RDI->super_SVIntStorage).signFlag & 1U) != 0) {
      bits = CONCAT13((in_RSI->super_SVIntStorage).signFlag,in_stack_ffffffffffffff94);
    }
    bVar5 = (byte)(bits >> 0x18) & 1;
    bVar3 = SUB41((uint)in_stack_ffffffffffffff90 >> 0x18,0);
    if ((in_RSI->super_SVIntStorage).bitWidth <= (in_RDI->super_SVIntStorage).bitWidth) {
      extend(in_RDI,bits,bVar3);
      pSVar4 = operator|=(in_RSI,(SVInt *)CONCAT17(bVar5,in_stack_ffffffffffffffe0));
      ~SVInt((SVInt *)CONCAT44(bits,in_stack_ffffffffffffff90));
      return pSVar4;
    }
    extend(in_RDI,bits,bVar3);
    operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    ~SVInt((SVInt *)CONCAT44(bits,in_stack_ffffffffffffff90));
  }
  bVar3 = hasUnknown(in_RDI);
  if ((!bVar3) && (bVar3 = hasUnknown(in_RSI), bVar3)) {
    makeUnknown((SVInt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  bVar3 = isSingleWord(in_RDI);
  if (bVar3) {
    (in_RDI->super_SVIntStorage).field_0.val =
         (in_RSI->super_SVIntStorage).field_0.val | (in_RDI->super_SVIntStorage).field_0.val;
  }
  else {
    in_stack_ffffffffffffffb0 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
    if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
      for (in_stack_ffffffffffffffa0 = 0; in_stack_ffffffffffffffa0 < in_stack_ffffffffffffffb0;
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
        puVar2 = (in_RDI->super_SVIntStorage).field_0.pVal;
        puVar2[in_stack_ffffffffffffffa0] =
             (in_RSI->super_SVIntStorage).field_0.pVal[in_stack_ffffffffffffffa0] |
             puVar2[in_stack_ffffffffffffffa0];
      }
    }
    else {
      bVar3 = isSingleWord(in_RSI);
      if (bVar3) {
        uVar1 = (in_RDI->super_SVIntStorage).field_0.val;
        *(uint64_t *)(uVar1 + 8) =
             ((in_RSI->super_SVIntStorage).field_0.val ^ 0xffffffffffffffff) & *(ulong *)(uVar1 + 8)
        ;
        *(in_RDI->super_SVIntStorage).field_0.pVal =
             (*(ulong *)((in_RDI->super_SVIntStorage).field_0.val + 8) ^ 0xffffffffffffffff) &
             (*(in_RDI->super_SVIntStorage).field_0.pVal | (in_RSI->super_SVIntStorage).field_0.val)
        ;
      }
      else {
        bVar3 = hasUnknown(in_RSI);
        if (bVar3) {
          for (local_54 = 0; local_54 < in_stack_ffffffffffffffb0; local_54 = local_54 + 1) {
            (in_RDI->super_SVIntStorage).field_0.pVal[local_54 + in_stack_ffffffffffffffb0] =
                 (in_RDI->super_SVIntStorage).field_0.pVal[local_54 + in_stack_ffffffffffffffb0] &
                 ((in_RSI->super_SVIntStorage).field_0.pVal[local_54 + in_stack_ffffffffffffffb0] |
                 (in_RSI->super_SVIntStorage).field_0.pVal[local_54] ^ 0xffffffffffffffff) |
                 ((in_RDI->super_SVIntStorage).field_0.pVal[local_54] ^ 0xffffffffffffffff) &
                 (in_RSI->super_SVIntStorage).field_0.pVal[local_54 + in_stack_ffffffffffffffb0];
          }
        }
        else {
          for (local_58 = 0; local_58 < in_stack_ffffffffffffffb0; local_58 = local_58 + 1) {
            puVar2 = (in_RDI->super_SVIntStorage).field_0.pVal;
            puVar2[local_58 + in_stack_ffffffffffffffb0] =
                 ((in_RSI->super_SVIntStorage).field_0.pVal[local_58] ^ 0xffffffffffffffff) &
                 puVar2[local_58 + in_stack_ffffffffffffffb0];
          }
        }
        for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffa4 < in_stack_ffffffffffffffb0;
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
          (in_RDI->super_SVIntStorage).field_0.pVal[in_stack_ffffffffffffffa4] =
               ((in_RDI->super_SVIntStorage).field_0.pVal
                [in_stack_ffffffffffffffa4 + in_stack_ffffffffffffffb0] ^ 0xffffffffffffffff) &
               ((in_RDI->super_SVIntStorage).field_0.pVal[in_stack_ffffffffffffffa4] |
               (in_RSI->super_SVIntStorage).field_0.pVal[in_stack_ffffffffffffffa4]);
        }
      }
    }
  }
  clearUnusedBits((SVInt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  checkUnknown((SVInt *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return in_RDI;
}

Assistant:

SVInt& SVInt::operator|=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this |= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val |= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord()) {
                pVal[1] &= ~rhs.val;
                pVal[0] = ~pVal[1] & (pVal[0] | rhs.val);
            }
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++) {
                        pVal[i + words] = (pVal[i + words] & (rhs.pVal[i + words] | ~rhs.pVal[i])) |
                                          (~pVal[i] & rhs.pVal[i + words]);
                    }
                }
                else {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] &= ~rhs.pVal[i];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] | rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] |= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    checkUnknown();
    return *this;
}